

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

UText * __thiscall
icu_63::RegexMatcher::group
          (RegexMatcher *this,int32_t groupNum,UText *dest,int64_t *group_len,UErrorCode *status)

{
  UVector32 *pUVar1;
  long index;
  int iVar2;
  int64_t *piVar3;
  long lVar4;
  UText *pUVar5;
  int64_t *piVar6;
  
  *group_len = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      if (this->fMatch == '\0') {
        *status = U_REGEX_INVALID_STATE;
      }
      else if ((groupNum < 0) || (this->fPattern->fGroupMap->count < groupNum)) {
        *status = U_INDEX_OUTOFBOUNDS_ERROR;
      }
      else {
        if (groupNum == 0) {
          piVar6 = &this->fMatchStart;
          piVar3 = &this->fMatchEnd;
        }
        else {
          pUVar1 = this->fPattern->fGroupMap;
          iVar2 = 0;
          if (groupNum <= pUVar1->count) {
            iVar2 = pUVar1->elements[(ulong)(uint)groupNum - 1];
          }
          piVar6 = this->fFrame->fExtra + iVar2;
          piVar3 = this->fFrame[1].fExtra + (long)iVar2 + -2;
        }
        index = *piVar6;
        if (index < 0) {
          pUVar5 = utext_clone_63(dest,this->fInputText,'\0','\x01',status);
          return pUVar5;
        }
        *group_len = *piVar3 - index;
        dest = utext_clone_63(dest,this->fInputText,'\0','\x01',status);
        if (dest == (UText *)0x0) {
          dest = (UText *)0x0;
        }
        else {
          lVar4 = index - dest->chunkNativeStart;
          if (((lVar4 < 0) || (dest->nativeIndexingLimit <= lVar4)) ||
             (0xdbff < (ushort)dest->chunkContents[lVar4])) {
            utext_setNativeIndex_63(dest,index);
          }
          else {
            dest->chunkOffset = (int32_t)lVar4;
          }
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::group(int32_t groupNum, UText *dest, int64_t &group_len, UErrorCode &status) const {
    group_len = 0;
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
    } else if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
    } else if (groupNum < 0 || groupNum > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
    }

    if (U_FAILURE(status)) {
        return dest;
    }

    int64_t s, e;
    if (groupNum == 0) {
        s = fMatchStart;
        e = fMatchEnd;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(groupNum-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
        e = fFrame->fExtra[groupOffset+1];
    }

    if (s < 0) {
        // A capture group wasn't part of the match
        return utext_clone(dest, fInputText, FALSE, TRUE, &status);
    }
    U_ASSERT(s <= e);
    group_len = e - s;

    dest = utext_clone(dest, fInputText, FALSE, TRUE, &status);
    if (dest)
        UTEXT_SETNATIVEINDEX(dest, s);
    return dest;
}